

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O2

string * __thiscall
slang::DiagnosticClient::getFileName_abi_cxx11_
          (string *__return_storage_ptr__,DiagnosticClient *this,SourceLocation location)

{
  path *__str;
  allocator<char> local_19;
  string_view local_18;
  
  if (this->absPaths == true) {
    __str = SourceManager::getFullPath_abi_cxx11_
                      (this->sourceManager,(BufferID)(location._0_4_ & 0xfffffff));
    std::__cxx11::string::string((string *)__return_storage_ptr__,&__str->_M_pathname);
  }
  else {
    local_18 = SourceManager::getFileName(this->sourceManager,location);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&local_18,&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DiagnosticClient::getFileName(SourceLocation location) const {
    if (absPaths)
        return getU8Str(sourceManager->getFullPath(location.buffer()));
    else
        return std::string(sourceManager->getFileName(location));
}